

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_data.cpp
# Opt level: O3

void __thiscall duckdb::ClientData::ClientData(ClientData *this,ClientContext *context)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::FileOpener_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var4;
  StorageOptions options;
  QueryProfiler *pQVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Head_base<0UL,_duckdb::CatalogSearchPath_*,_false> this_01;
  type __args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  DatabaseManager *pDVar8;
  AttachedDatabase *pAVar9;
  RandomEngine *this_02;
  _Head_base<0UL,_duckdb::FileOpener_*,_false> _Var10;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var11;
  HTTPLogger *__tmp_1;
  pointer *__ptr_1;
  QueryProfiler *__tmp;
  pointer *__ptr;
  undefined1 local_89;
  QueryProfiler *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  AttachedDatabaseType local_74;
  unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>,_true> *local_70;
  unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>,_true> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  (this->temporary_objects).internal.
  super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->http_logger).internal.super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->prepared_statements)._M_h._M_buckets = &(this->prepared_statements)._M_h._M_single_bucket;
  (this->prepared_statements)._M_h._M_bucket_count = 1;
  (this->prepared_statements)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->prepared_statements)._M_h._M_element_count = 0;
  (this->prepared_statements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_68 = &this->random_engine;
  *(undefined1 (*) [16])&(this->prepared_statements)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->log_query_writer =
       (unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>)0x0
  ;
  this->random_engine =
       (unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>)0x0;
  this_01._M_head_impl = (CatalogSearchPath *)operator_new(0x38);
  CatalogSearchPath::CatalogSearchPath(this_01._M_head_impl,context);
  (this->catalog_search_path).
  super_unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>._M_t.
  super___uniq_ptr_impl<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogSearchPath_*,_std::default_delete<duckdb::CatalogSearchPath>_>
  .super__Head_base<0UL,_duckdb::CatalogSearchPath_*,_false>._M_head_impl = this_01._M_head_impl;
  local_70 = &this->file_opener;
  local_60 = &(this->file_search_path).field_2;
  this->file_opener = (unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>)0x0;
  this->client_file_system =
       (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)0x0;
  (this->file_search_path)._M_dataplus._M_p = (pointer)local_60;
  (this->file_search_path)._M_string_length = 0;
  (this->file_search_path).field_2._M_local_buf[0] = '\0';
  this->debug_set_max_line_length = false;
  this->debug_max_line_length = 0;
  __args = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&context->db);
  local_88 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::QueryProfiler,std::allocator<duckdb::QueryProfiler>,duckdb::ClientContext&>
            (&local_80,&local_88,(allocator<duckdb::QueryProfiler> *)&local_74,context);
  _Var6._M_pi = local_80._M_pi;
  pQVar5 = local_88;
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_01659608;
    }
    else {
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
LAB_01659608:
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pQVar5;
  p_Var7 = (this->profiler).internal.
           super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0246ca70;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)context;
  *(undefined1 (*) [16])&p_Var7[1]._M_use_count = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&p_Var7[2]._M_use_count = (undefined1  [16])0x0;
  p_Var7[3]._M_use_count = 0;
  p_Var7[3]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var7->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  (this->http_logger).internal.super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var7 + 1);
  this_00 = (this->http_logger).internal.
            super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->http_logger).internal.super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_74 = TEMP_DATABASE;
  local_88 = (QueryProfiler *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::AttachedDatabase,std::allocator<duckdb::AttachedDatabase>,duckdb::DatabaseInstance&,duckdb::AttachedDatabaseType>
            (&local_80,(AttachedDatabase **)&local_88,
             (allocator<duckdb::AttachedDatabase> *)&local_89,__args,&local_74);
  pQVar5 = local_88;
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_01659701;
    }
    else {
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
LAB_01659701:
  (this->temporary_objects).internal.
  super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pQVar5;
  p_Var7 = (this->temporary_objects).internal.
           super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->temporary_objects).internal.
  super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_80._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  pDVar8 = DatabaseInstance::GetDatabaseManager(__args);
  LOCK();
  paVar1 = &pDVar8->next_oid;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pAVar9 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(&this->temporary_objects);
  (pAVar9->super_CatalogEntry).oid = _Var2;
  this_02 = (RandomEngine *)operator_new(0x30);
  RandomEngine::RandomEngine(this_02,-1);
  ::std::__uniq_ptr_impl<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>::reset
            ((__uniq_ptr_impl<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_> *)
             local_68,this_02);
  _Var10._M_head_impl = (FileOpener *)operator_new(0x10);
  (_Var10._M_head_impl)->_vptr_FileOpener = (_func_int **)&PTR__FileOpener_0246c7c8;
  _Var10._M_head_impl[1]._vptr_FileOpener = (_func_int **)context;
  _Var3._M_head_impl =
       (local_70->super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>).
       _M_t.super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
       super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl;
  (local_70->super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
  super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl = _Var10._M_head_impl;
  if (_Var3._M_head_impl != (FileOpener *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_FileOpener[1])();
  }
  _Var11._M_head_impl = (FileSystem *)operator_new(0x10);
  (_Var11._M_head_impl)->_vptr_FileSystem = (_func_int **)&PTR__FileSystem_0246cb10;
  _Var11._M_head_impl[1]._vptr_FileSystem = (_func_int **)context;
  _Var4._M_head_impl =
       (this->client_file_system).
       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
       super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
  (this->client_file_system).
  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = _Var11._M_head_impl;
  if (_Var4._M_head_impl != (FileSystem *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_FileSystem[1])();
  }
  pAVar9 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(&this->temporary_objects);
  local_38 = 0;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  options.row_group_size.index = 0xffffffffffffffff;
  options.block_alloc_size.index = 0xffffffffffffffff;
  options.storage_version.index = 0xffffffffffffffff;
  options.block_header_size.index = 0xffffffffffffffff;
  options._32_8_ = 0;
  AttachedDatabase::Initialize(pAVar9,(optional_ptr<duckdb::ClientContext,_true>)0x0,options);
  return;
}

Assistant:

ClientData::ClientData(ClientContext &context) : catalog_search_path(make_uniq<CatalogSearchPath>(context)) {
	auto &db = DatabaseInstance::GetDatabase(context);
	profiler = make_shared_ptr<QueryProfiler>(context);
	http_logger = make_shared_ptr<HTTPLogger>(context);
	temporary_objects = make_shared_ptr<AttachedDatabase>(db, AttachedDatabaseType::TEMP_DATABASE);
	temporary_objects->oid = DatabaseManager::Get(db).NextOid();
	random_engine = make_uniq<RandomEngine>();
	file_opener = make_uniq<ClientContextFileOpener>(context);
	client_file_system = make_uniq<ClientFileSystem>(context);
	temporary_objects->Initialize();
}